

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extended_matrix.cpp
# Opt level: O2

string * __thiscall
ExtendedMatrix::ToString_abi_cxx11_(string *__return_storage_ptr__,ExtendedMatrix *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  Fraction *f;
  int column;
  ostringstream out;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&out);
  iVar1 = Matrix::GetNumRows(&this->main_);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&out,iVar1);
  poVar4 = std::operator<<(poVar4,' ');
  iVar1 = GetNumColumns(this);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar1);
  std::endl<char,std::char_traits<char>>(poVar4);
  iVar1 = 0;
  while( true ) {
    iVar2 = Matrix::GetNumRows(&this->main_);
    if (iVar2 <= iVar1) break;
    iVar2 = 0;
    while( true ) {
      iVar3 = GetNumColumns(this);
      if (iVar3 <= iVar2) break;
      f = At(this,iVar1,iVar2);
      poVar4 = operator<<((ostream *)&out,f);
      std::operator<<(poVar4,' ');
      iVar2 = iVar2 + 1;
    }
    iVar2 = Matrix::GetNumRows(&this->main_);
    iVar1 = iVar1 + 1;
    if (iVar1 != iVar2) {
      std::endl<char,std::char_traits<char>>((ostream *)&out);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&out);
  return __return_storage_ptr__;
}

Assistant:

std::string ExtendedMatrix::ToString() const {
  std::ostringstream out;
  out << GetNumRows() << ' ' << GetNumColumns() << std::endl;
  for (int row = 0; row < GetNumRows(); ++row) {
    for (int column = 0; column < GetNumColumns(); ++column) {
      out << At(row, column) << ' ';
    }
    if (row + 1 != GetNumRows()) {
      out << std::endl;
    }
  }

  return out.str();
}